

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O1

OPJ_BOOL opj_mct_decode_custom
                   (OPJ_BYTE *pDecodingData,OPJ_SIZE_T n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  undefined4 uVar1;
  OPJ_BYTE *pOVar2;
  OPJ_BOOL OVar3;
  void *ptr;
  ulong uVar4;
  OPJ_SIZE_T OVar5;
  ulong uVar6;
  OPJ_BYTE *pOVar7;
  long lVar8;
  float fVar9;
  
  ptr = opj_malloc((ulong)(pNbComp * 2) << 2);
  if (ptr == (void *)0x0) {
    OVar3 = 0;
  }
  else {
    if (n != 0) {
      uVar4 = (ulong)pNbComp;
      OVar5 = 0;
      do {
        if (pNbComp != 0) {
          uVar6 = 0;
          do {
            *(undefined4 *)((long)ptr + uVar6 * 4) = *(undefined4 *)pData[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          if (pNbComp != 0) {
            uVar6 = 0;
            pOVar7 = pDecodingData;
            do {
              *(undefined4 *)((long)ptr + uVar6 * 4 + uVar4 * 4) = 0;
              fVar9 = 0.0;
              lVar8 = 0;
              do {
                fVar9 = fVar9 + *(float *)(pOVar7 + lVar8) * *(float *)((long)ptr + lVar8);
                *(float *)((long)ptr + uVar6 * 4 + uVar4 * 4) = fVar9;
                lVar8 = lVar8 + 4;
              } while (uVar4 * 4 - lVar8 != 0);
              uVar1 = *(undefined4 *)((long)ptr + uVar6 * 4 + uVar4 * 4);
              pOVar2 = pData[uVar6];
              pData[uVar6] = pOVar2 + 4;
              *(undefined4 *)pOVar2 = uVar1;
              uVar6 = uVar6 + 1;
              pOVar7 = pOVar7 + lVar8;
            } while (uVar6 != uVar4);
          }
        }
        OVar5 = OVar5 + 1;
      } while (OVar5 != n);
    }
    opj_free(ptr);
    OVar3 = 1;
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_mct_decode_custom(
    OPJ_BYTE * pDecodingData,
    OPJ_SIZE_T n,
    OPJ_BYTE ** pData,
    OPJ_UINT32 pNbComp,
    OPJ_UINT32 isSigned)
{
    OPJ_FLOAT32 * lMct;
    OPJ_SIZE_T i;
    OPJ_UINT32 j;
    OPJ_UINT32 k;

    OPJ_FLOAT32 * lCurrentData = 00;
    OPJ_FLOAT32 * lCurrentResult = 00;
    OPJ_FLOAT32 ** lData = (OPJ_FLOAT32 **) pData;

    OPJ_ARG_NOT_USED(isSigned);

    lCurrentData = (OPJ_FLOAT32 *) opj_malloc(2 * pNbComp * sizeof(OPJ_FLOAT32));
    if (! lCurrentData) {
        return OPJ_FALSE;
    }
    lCurrentResult = lCurrentData + pNbComp;

    for (i = 0; i < n; ++i) {
        lMct = (OPJ_FLOAT32 *) pDecodingData;
        for (j = 0; j < pNbComp; ++j) {
            lCurrentData[j] = (OPJ_FLOAT32)(*(lData[j]));
        }
        for (j = 0; j < pNbComp; ++j) {
            lCurrentResult[j] = 0;
            for (k = 0; k < pNbComp; ++k) {
                lCurrentResult[j] += *(lMct++) * lCurrentData[k];
            }
            *(lData[j]++) = (OPJ_FLOAT32)(lCurrentResult[j]);
        }
    }
    opj_free(lCurrentData);
    return OPJ_TRUE;
}